

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O1

int uv_cpu_info(uv_cpu_info_t **cpu_infos,int *count)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  uv_cpu_info_t *cpu_infos_00;
  FILE *pFVar5;
  size_t sVar6;
  char *pcVar7;
  int *piVar8;
  uv_cpu_info_t *puVar9;
  uint unaff_EBP;
  ulong __nmemb;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  unsigned_long user;
  uint local_474;
  uint *local_470;
  uv_cpu_info_t **local_468;
  unsigned_long irq;
  unsigned_long idle;
  unsigned_long sys;
  unsigned_long nice;
  unsigned_long dummy;
  char buf [1024];
  
  *cpu_infos = (uv_cpu_info_t *)0x0;
  *count = 0;
  __stream = (FILE *)uv__open_file("/proc/stat");
  if (__stream == (FILE *)0x0) {
    piVar8 = __errno_location();
    return -*piVar8;
  }
  pcVar4 = fgets(buf,0x400,__stream);
  if (pcVar4 == (char *)0x0) {
    iVar13 = -5;
  }
  else {
    pcVar4 = fgets(buf,0x400,__stream);
    unaff_EBP = 0;
    if (pcVar4 != (char *)0x0) {
      do {
        if (buf[2] != 'u' || buf._0_2_ != 0x7063) break;
        unaff_EBP = unaff_EBP + 1;
        pcVar4 = fgets(buf,0x400,__stream);
      } while (pcVar4 != (char *)0x0);
    }
    iVar13 = (uint)(unaff_EBP != 0) * 5 + -5;
  }
  if (-1 < iVar13) {
    __nmemb = (ulong)unaff_EBP;
    local_468 = cpu_infos;
    cpu_infos_00 = (uv_cpu_info_t *)uv__calloc(__nmemb,0x38);
    if (cpu_infos_00 != (uv_cpu_info_t *)0x0) {
      pFVar5 = (FILE *)uv__open_file("/proc/cpuinfo");
      local_470 = (uint *)count;
      if (pFVar5 == (FILE *)0x0) {
        piVar8 = __errno_location();
        iVar13 = -*piVar8;
      }
      else {
        pcVar4 = fgets(buf,0x400,pFVar5);
        if (pcVar4 == (char *)0x0) {
          uVar14 = 0;
        }
        else {
          uVar12 = 0;
          uVar14 = 0;
          do {
            uVar12 = uVar12 & 0xffffffff;
            while ((__nmemb <= uVar14 ||
                   (CONCAT26(buf._11_2_,CONCAT33(buf._8_3_,buf._5_3_)) != 0x203a09656d616e20 ||
                    CONCAT44(buf._4_4_,CONCAT13(buf[3],CONCAT12(buf[2],buf._0_2_))) !=
                    0x616e206c65646f6d))) {
              uVar15 = uVar12;
              if ((uVar12 < __nmemb) &&
                 (CONCAT35(buf._8_3_,CONCAT41(buf._4_4_,buf[3])) == 0x203a09097a484d20 &&
                  CONCAT44(buf._4_4_,CONCAT13(buf[3],CONCAT12(buf[2],buf._0_2_))) ==
                  0x97a484d20757063)) {
                iVar13 = atoi(buf + 0xb);
                uVar15 = uVar12 + 1;
                cpu_infos_00[uVar12].speed = iVar13;
              }
              pcVar4 = fgets(buf,0x400,pFVar5);
              uVar12 = uVar15;
              if (pcVar4 == (char *)0x0) goto LAB_004e8e01;
            }
            sVar6 = strlen(buf + 0xd);
            pcVar4 = uv__strndup(buf + 0xd,sVar6 - 1);
            if (pcVar4 == (char *)0x0) {
              fclose(pFVar5);
              goto LAB_004e8e70;
            }
            uVar15 = uVar14 + 1;
            cpu_infos_00[uVar14].model = pcVar4;
            pcVar4 = fgets(buf,0x400,pFVar5);
            uVar14 = uVar15;
          } while (pcVar4 != (char *)0x0);
        }
LAB_004e8e01:
        fclose(pFVar5);
        uVar10 = (uint)uVar14;
        if (uVar10 == 0) {
          pcVar4 = "unknown";
        }
        else {
          pcVar4 = cpu_infos_00[uVar10 - 1].model;
        }
        iVar13 = 0;
        if (uVar10 < unaff_EBP) {
          puVar9 = cpu_infos_00 + (uVar14 & 0xffffffff);
          lVar11 = __nmemb - (uVar14 & 0xffffffff);
          do {
            sVar6 = strlen(pcVar4);
            pcVar7 = uv__strndup(pcVar4,sVar6);
            if (pcVar7 == (char *)0x0) goto LAB_004e8e70;
            puVar9->model = pcVar7;
            puVar9 = puVar9 + 1;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
      }
      goto LAB_004e8e7b;
    }
    iVar13 = -0xc;
  }
LAB_004e90fc:
  iVar3 = fclose(__stream);
  if (iVar3 != 0) {
    piVar8 = __errno_location();
    if ((*piVar8 != 4) && (*piVar8 != 0x73)) {
LAB_004e912e:
      abort();
    }
  }
  return iVar13;
LAB_004e8e70:
  iVar13 = -0xc;
LAB_004e8e7b:
  if (iVar13 == 0) {
    lVar11 = sysconf(2);
    if (lVar11 == 0) {
      __assert_fail("clock_ticks != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                    ,0x2db,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
    }
    if (lVar11 == -1) {
      __assert_fail("clock_ticks != (unsigned long) -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                    ,0x2da,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
    }
    rewind(__stream);
    pcVar4 = fgets(buf,0x400,__stream);
    if (pcVar4 == (char *)0x0) goto LAB_004e912e;
    pcVar4 = fgets(buf,0x400,__stream);
    uVar10 = 0;
    if ((unaff_EBP != 0) && (pcVar4 != (char *)0x0)) {
      uVar14 = 0;
      while (uVar12 = uVar14, buf[2] == 'u' && buf._0_2_ == 0x7063) {
        iVar13 = __isoc99_sscanf(buf,"cpu%u ",&local_474);
        if (iVar13 != 1) {
          __assert_fail("r == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                        ,0x2ef,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
        }
        uVar2 = 4;
        uVar10 = local_474;
        do {
          uVar2 = uVar2 + 1;
          bVar1 = 9 < uVar10;
          uVar10 = uVar10 / 10;
        } while (bVar1);
        iVar13 = __isoc99_sscanf(buf + uVar2,"%lu %lu %lu %lu %lu %lu",&user,&nice,&sys,&idle,&dummy
                                 ,&irq);
        if (iVar13 != 6) goto LAB_004e912e;
        uVar12 = uVar14 + 1;
        cpu_infos_00[uVar14].cpu_times.user = user * lVar11;
        cpu_infos_00[uVar14].cpu_times.nice = nice * lVar11;
        cpu_infos_00[uVar14].cpu_times.sys = sys * lVar11;
        cpu_infos_00[uVar14].cpu_times.idle = idle * lVar11;
        cpu_infos_00[uVar14].cpu_times.irq = irq * lVar11;
        pcVar4 = fgets(buf,0x400,__stream);
        if ((pcVar4 == (char *)0x0) || (uVar14 = uVar12, __nmemb <= uVar12)) break;
      }
      uVar10 = (uint)uVar12;
    }
    if (uVar10 != unaff_EBP) {
      __assert_fail("num == numcpus",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                    ,0x30b,"int read_times(FILE *, unsigned int, uv_cpu_info_t *)");
    }
    iVar13 = 0;
  }
  if (iVar13 == 0) {
    if (unaff_EBP != 0 && cpu_infos_00->speed == 0) {
      piVar8 = &cpu_infos_00->speed;
      uVar14 = 0;
      do {
        snprintf(buf,0x400,"/sys/devices/system/cpu/cpu%u/cpufreq/scaling_cur_freq",
                 uVar14 & 0xffffffff);
        pFVar5 = (FILE *)uv__open_file(buf);
        iVar13 = 0;
        if (pFVar5 != (FILE *)0x0) {
          iVar13 = __isoc99_fscanf(pFVar5,"%lu",&user);
          if (iVar13 != 1) {
            user = 0;
          }
          fclose(pFVar5);
          iVar13 = (int)(user / 1000);
        }
        *piVar8 = iVar13;
        uVar14 = uVar14 + 1;
        piVar8 = piVar8 + 0xe;
      } while (__nmemb != uVar14);
    }
    *local_468 = cpu_infos_00;
    *local_470 = unaff_EBP;
    iVar13 = 0;
  }
  else {
    uv_free_cpu_info(cpu_infos_00,unaff_EBP);
  }
  goto LAB_004e90fc;
}

Assistant:

int uv_cpu_info(uv_cpu_info_t** cpu_infos, int* count) {
  unsigned int numcpus;
  uv_cpu_info_t* ci;
  int err;
  FILE* statfile_fp;

  *cpu_infos = NULL;
  *count = 0;

  statfile_fp = uv__open_file("/proc/stat");
  if (statfile_fp == NULL)
    return UV__ERR(errno);

  err = uv__cpu_num(statfile_fp, &numcpus);
  if (err < 0)
    goto out;

  err = UV_ENOMEM;
  ci = uv__calloc(numcpus, sizeof(*ci));
  if (ci == NULL)
    goto out;

  err = read_models(numcpus, ci);
  if (err == 0)
    err = read_times(statfile_fp, numcpus, ci);

  if (err) {
    uv_free_cpu_info(ci, numcpus);
    goto out;
  }

  /* read_models() on x86 also reads the CPU speed from /proc/cpuinfo.
   * We don't check for errors here. Worst case, the field is left zero.
   */
  if (ci[0].speed == 0)
    read_speeds(numcpus, ci);

  *cpu_infos = ci;
  *count = numcpus;
  err = 0;

out:

  if (fclose(statfile_fp))
    if (errno != EINTR && errno != EINPROGRESS)
      abort();

  return err;
}